

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

ssize_t bgzf_raw_write(BGZF *fp,void *data,size_t length)

{
  hFILE *fp_00;
  ssize_t sVar1;
  size_t __n;
  ulong uVar2;
  
  fp_00 = fp->fp;
  uVar2 = (long)fp_00->limit - (long)fp_00->begin;
  __n = length;
  if (uVar2 < length) {
    __n = uVar2;
  }
  memcpy(fp_00->begin,data,__n);
  fp_00->begin = fp_00->begin + __n;
  if (uVar2 < length) {
    sVar1 = hwrite2(fp_00,data,length,__n);
    return sVar1;
  }
  return __n;
}

Assistant:

ssize_t bgzf_raw_write(BGZF *fp, const void *data, size_t length)
{
    return hwrite(fp->fp, data, length);
}